

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ranges.cpp
# Opt level: O0

void test_parse_and_check_false
               (string_view range_str,string_view ver_str,version_compare_option option)

{
  StringRef capturedExpression;
  string_view str;
  bool value;
  Flags resultDisposition;
  MessageBuilder *pMVar1;
  from_chars_result fVar2;
  string_view str_00;
  Decomposer local_362;
  ExprLhs<bool> local_361;
  StringRef local_360;
  SourceLineInfo local_350;
  StringRef local_340;
  undefined1 local_330 [8];
  AssertionHandler catchAssertionHandler_2;
  from_chars_result local_2d8;
  Decomposer local_2c1;
  ExprLhs<const_semver::from_chars_result_&> local_2c0;
  StringRef local_2b8;
  SourceLineInfo local_2a8;
  StringRef local_298;
  undefined1 local_288 [8];
  AssertionHandler catchAssertionHandler_1;
  range_set<int,_int,_int> rs;
  from_chars_result local_210;
  Decomposer local_1f9;
  ExprLhs<const_semver::from_chars_result_&> local_1f8;
  StringRef local_1f0;
  SourceLineInfo local_1e0;
  StringRef local_1d0;
  undefined1 local_1c0 [8];
  AssertionHandler catchAssertionHandler;
  version<int,_int,_int> v;
  SourceLineInfo local_100;
  StringRef local_f0;
  MessageBuilder local_e0;
  undefined1 local_80 [8];
  ScopedMessage scopedMessage1;
  undefined1 auStack_28 [7];
  version_compare_option option_local;
  string_view ver_str_local;
  string_view range_str_local;
  
  str_00._M_len = range_str._M_str;
  ver_str_local._M_str = (char *)range_str._M_len;
  ver_str_local._M_len = (size_t)ver_str._M_str;
  _auStack_28 = ver_str._M_len;
  scopedMessage1._79_1_ = option;
  local_f0 = operator____catch_sr("INFO",4);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_ranges.cpp"
             ,0x16);
  Catch::MessageBuilder::MessageBuilder(&local_e0,&local_f0,&local_100,Info);
  pMVar1 = Catch::MessageBuilder::operator<<
                     (&local_e0,
                      (basic_string_view<char,_std::char_traits<char>_> *)&ver_str_local._M_str);
  pMVar1 = Catch::MessageBuilder::operator<<(pMVar1,(char (*) [4])" : ");
  pMVar1 = Catch::MessageBuilder::operator<<
                     (pMVar1,(basic_string_view<char,_std::char_traits<char>_> *)auStack_28);
  Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_80,pMVar1);
  Catch::MessageBuilder::~MessageBuilder(&local_e0);
  semver::version<int,_int,_int>::version
            ((version<int,_int,_int> *)&catchAssertionHandler.m_resultCapture);
  local_1d0 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1e0,
             "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_ranges.cpp"
             ,0x19);
  Catch::StringRef::StringRef(&local_1f0,"semver::parse(ver_str, v)");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_1c0,&local_1d0,&local_1e0,local_1f0,Normal);
  str._M_str = (char *)ver_str_local._M_len;
  str._M_len = _auStack_28;
  fVar2 = semver::parse<int,int,int>
                    (str,(version<int,_int,_int> *)&catchAssertionHandler.m_resultCapture);
  local_210.super_from_chars_result.ptr = fVar2.super_from_chars_result.ptr;
  local_210.super_from_chars_result.ec = fVar2.super_from_chars_result.ec;
  local_1f8 = Catch::Decomposer::operator<=(&local_1f9,&local_210);
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            ((AssertionHandler *)local_1c0,&local_1f8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_1c0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1c0);
  semver::range_set<int,_int,_int>::range_set
            ((range_set<int,_int,_int> *)&catchAssertionHandler_1.m_resultCapture);
  local_298 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2a8,
             "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_ranges.cpp"
             ,0x1c);
  Catch::StringRef::StringRef(&local_2b8,"semver::parse(range_str, rs)");
  capturedExpression.m_size = local_2b8.m_size;
  capturedExpression.m_start = local_2b8.m_start;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_288,&local_298,&local_2a8,capturedExpression,Normal);
  catchAssertionHandler_2.m_resultCapture = (IResultCapture *)ver_str_local._M_str;
  str_00._M_str = (char *)&catchAssertionHandler_1.m_resultCapture;
  fVar2 = semver::parse<int,int,int>
                    ((semver *)ver_str_local._M_str,str_00,
                     (range_set<int,_int,_int> *)local_2b8.m_start);
  local_2d8.super_from_chars_result.ptr = fVar2.super_from_chars_result.ptr;
  local_2d8.super_from_chars_result.ec = fVar2.super_from_chars_result.ec;
  local_2c0 = Catch::Decomposer::operator<=(&local_2c1,&local_2d8);
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            ((AssertionHandler *)local_288,&local_2c0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_288);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_288);
  local_340 = operator____catch_sr("REQUIRE_FALSE",0xd);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_350,
             "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_ranges.cpp"
             ,0x1e);
  Catch::StringRef::StringRef(&local_360,"rs.contains(v, option)");
  resultDisposition = Catch::operator|(Normal,FalseTest);
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_330,&local_340,&local_350,local_360,resultDisposition);
  value = semver::range_set<int,_int,_int>::contains
                    ((range_set<int,_int,_int> *)&catchAssertionHandler_1.m_resultCapture,
                     (version<int,_int,_int> *)&catchAssertionHandler.m_resultCapture,
                     scopedMessage1._79_1_);
  local_361 = Catch::Decomposer::operator<=(&local_362,value);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_330,&local_361);
  Catch::AssertionHandler::complete((AssertionHandler *)local_330);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_330);
  semver::range_set<int,_int,_int>::~range_set
            ((range_set<int,_int,_int> *)&catchAssertionHandler_1.m_resultCapture);
  semver::version<int,_int,_int>::~version
            ((version<int,_int,_int> *)&catchAssertionHandler.m_resultCapture);
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_80);
  return;
}

Assistant:

static void test_parse_and_check_false(std::string_view range_str, std::string_view ver_str,
  semver::version_compare_option option = semver::version_compare_option::exclude_prerelease)
{
  INFO(range_str << " : " << ver_str);

  semver::version v;
  REQUIRE(semver::parse(ver_str, v));

  semver::range_set rs;
  REQUIRE(semver::parse(range_str, rs));

  REQUIRE_FALSE(rs.contains(v, option));
}